

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O3

void __thiscall Assimp::MDLImporter::InternReadFile_3DGS_MDL7(MDLImporter *this)

{
  undefined8 *puVar1;
  char *__s;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  aiScene *paVar7;
  pointer ppaVar8;
  void *pvVar9;
  undefined8 uVar10;
  Header_MDL7 *pHVar11;
  uint32_t uVar12;
  ai_uint32 aVar13;
  Logger *pLVar14;
  aiMaterial *paVar15;
  aiNode *paVar16;
  ulong *puVar17;
  aiMesh **ppaVar18;
  aiNode **ppaVar19;
  uint *puVar20;
  size_t sVar21;
  aiNode *this_00;
  int iVar22;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *pvVar23;
  uint uVar24;
  Header_MDL7 *pcHeader;
  pointer ppaVar25;
  MDLImporter *this_01;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  _Alloc_hider _Var29;
  aiNode *pcOldRoot;
  long lVar30;
  IntBone_MDL7 **ppIVar31;
  int iMode;
  IntSplitGroupData_MDL7 splitGroupData;
  IntSharedData_MDL7 sharedData;
  IntGroupInfo_MDL7 groupInfo;
  IntGroupData_MDL7 groupData;
  Header_MDL7 *local_510;
  ulong local_508;
  value_type local_500;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *local_4f0;
  Header_MDL7 *local_4e8;
  IntSplitGroupData_MDL7 local_4e0;
  void *local_4c8;
  undefined1 local_4c0 [24];
  uint local_4a8;
  _Base_ptr local_498;
  iterator local_490;
  aiMaterial **local_488;
  IntBone_MDL7 **local_480;
  _Alloc_hider local_470;
  ulong local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  Header_MDL7 *local_450;
  uint16_t *puStack_448;
  _Alloc_hider local_440;
  undefined1 local_438 [20];
  undefined1 local_424 [4];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_420;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_408;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3f0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_3d8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_3c0;
  bool local_3a8;
  
  if (this->pScene == (aiScene *)0x0) {
    __assert_fail("__null != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                  ,0x543,"void Assimp::MDLImporter::InternReadFile_3DGS_MDL7()");
  }
  this_01 = (MDLImporter *)local_4c0;
  MDL::IntSharedData_MDL7::IntSharedData_MDL7((IntSharedData_MDL7 *)this_01);
  pcHeader = (Header_MDL7 *)this->mBuffer;
  local_510 = pcHeader + 1;
  ValidateHeader_3DGS_MDL7(this_01,pcHeader);
  local_510 = (Header_MDL7 *)
              (local_510->ident + (uint)pcHeader->bone_stc_size * pcHeader->bones_num);
  local_480 = LoadBones_3DGS_MDL7(this);
  uVar27 = (ulong)pcHeader->groups_num;
  local_470._M_p = (pointer)operator_new__(uVar27 * 0x18 + 8);
  *(ulong *)local_470._M_p = uVar27;
  pvVar23 = (vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)((long)local_470._M_p + 8);
  if (uVar27 != 0) {
    memset(pvVar23,0,((uVar27 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  local_4f0 = pvVar23;
  if (pcHeader->groups_num == 0) {
    uVar24 = 0;
  }
  else {
    uVar27 = 0;
    do {
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(pvVar23,3);
      uVar27 = uVar27 + 1;
      uVar24 = pcHeader->groups_num;
      pvVar23 = pvVar23 + 1;
    } while (uVar27 < uVar24);
  }
  local_468 = (ulong)(uVar24 << 4);
  local_4c8 = operator_new__(local_468);
  local_4e8 = pcHeader;
  if (uVar24 != 0) {
    uVar27 = 0;
    do {
      pHVar11 = local_510;
      local_460._M_allocated_capacity._0_4_ = (undefined4)uVar27;
      local_460._8_8_ = local_510;
      local_450 = (Header_MDL7 *)0x0;
      puStack_448 = (uint16_t *)0x0;
      local_440._M_p = (pointer)0x0;
      local_510 = (Header_MDL7 *)&local_510->bonetrans_stc_size;
      local_508 = uVar27;
      SizeCheck(this,local_510,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x577);
      if ((char)*(uint16_t *)pHVar11->ident != '\x01') {
        pLVar14 = DefaultLogger::get();
        Logger::warn(pLVar14,"[3DGS MDL7] Not a triangle mesh group. Continuing happily");
      }
      uVar27 = (ulong)(uint)((int)local_508 << 4);
      uVar10 = *(undefined8 *)&pHVar11->data_size;
      puVar1 = (undefined8 *)((long)local_4c8 + uVar27);
      *puVar1 = *(undefined8 *)&pHVar11->bones_num;
      puVar1[1] = uVar10;
      *(undefined1 *)((long)local_4c8 + uVar27 + 0xf) = 0;
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::reserve
                ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&local_498,
                 (long)pHVar11->medlump_size + ((long)local_490._M_current - (long)local_498 >> 3));
      std::vector<bool,_std::allocator<bool>_>::resize
                ((vector<bool,_std::allocator<bool>_> *)local_4c0,
                 (long)pHVar11->medlump_size + (ulong)local_4a8 +
                 (local_4c0._16_8_ - local_4c0._0_8_) * 8,false);
      if (pHVar11->medlump_size != 0) {
        uVar24 = 0;
        do {
          ParseSkinLump_3DGS_MDL7
                    (this,(uchar *)local_510,(uchar **)&local_510,
                     (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&local_498);
          uVar24 = uVar24 + 1;
        } while (uVar24 < (uint)pHVar11->medlump_size);
      }
      if (local_498 == (_Base_ptr)local_490._M_current) {
        local_500.x = 2.8026e-45;
        paVar15 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(paVar15);
        local_438._0_4_ = SUB84(paVar15,0);
        local_438._4_4_ = (undefined4)((ulong)paVar15 >> 0x20);
        if (local_490._M_current == local_488) {
          std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*>
                    ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_498,local_490,
                     (aiMaterial **)local_438);
        }
        else {
          *local_490._M_current = paVar15;
          local_490._M_current = local_490._M_current + 1;
        }
        paVar15 = *(aiMaterial **)local_498;
        aiMaterial::AddBinaryProperty(paVar15,&local_500,4,"$mat.shadingm",0,0,aiPTI_Integer);
        local_4e0.aiSplit =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> **)0x3f19999a3f19999a;
        local_4e0.shared._0_4_ = 0x3f19999a;
        aiMaterial::AddBinaryProperty(paVar15,&local_4e0,0xc,"$clr.diffuse",0,0,aiPTI_Float);
        aiMaterial::AddBinaryProperty(paVar15,&local_4e0,0xc,"$clr.specular",0,0,aiPTI_Float);
        local_4e0.aiSplit =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> **)0x3d4ccccd3d4ccccd;
        local_4e0.shared = (IntSharedData_MDL7 *)CONCAT44(local_4e0.shared._4_4_,0x3d4ccccd);
        aiMaterial::AddBinaryProperty(paVar15,&local_4e0,0xc,"$clr.ambient",0,0,aiPTI_Float);
        memset(local_424,0x1b,0x3f0);
        local_438._0_4_ = 0xf;
        local_438[4] = 'D';
        local_438[5] = 'e';
        local_438[6] = 'f';
        local_438[7] = 'a';
        local_438._8_4_ = 0x4d746c75;
        local_438._12_7_ = 0x6c616972657461;
        local_438[0x13] = '\0';
        aiMaterial::AddProperty(paVar15,(aiString *)local_438,"?mat.name",0,0);
        std::vector<bool,_std::allocator<bool>_>::resize
                  ((vector<bool,_std::allocator<bool>_> *)local_4c0,1,false);
      }
      pcHeader = local_4e8;
      local_450 = local_510;
      iVar22._0_2_ = pHVar11->bone_stc_size;
      iVar22._2_2_ = pHVar11->skin_stc_size;
      puStack_448 = (uint16_t *)
                    ((long)local_510->ident + (ulong)local_4e8->skinpoint_stc_size * (long)iVar22);
      iVar2._0_2_ = pHVar11->colorvalue_stc_size;
      iVar2._2_2_ = pHVar11->material_stc_size;
      local_440._M_p =
           (pointer)((long)puStack_448 + (long)iVar2 * (ulong)local_4e8->triangle_stc_size);
      iVar3._0_2_ = pHVar11->skinpoint_stc_size;
      iVar3._2_2_ = pHVar11->triangle_stc_size;
      local_510 = (Header_MDL7 *)
                  ((long)local_440._M_p + (ulong)local_4e8->mainvertex_stc_size * (long)iVar3);
      SizeCheck(this,local_510,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x5c2);
      local_4e0.avOutList = local_4f0 + local_508;
      local_4e0.aiSplit = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)0x0;
      local_4e0.shared = (IntSharedData_MDL7 *)local_4c0;
      memset(local_438,0,0x91);
      if ((*(int *)&pHVar11->colorvalue_stc_size == 0) ||
         (iVar4._0_2_ = pHVar11->skinpoint_stc_size, iVar4._2_2_ = pHVar11->triangle_stc_size,
         iVar4 == 0)) {
        pLVar14 = DefaultLogger::get();
        Logger::warn(pLVar14,
                     "[3DGS MDL7] Mesh group consists of 0 vertices or faces. It will be skipped.");
      }
      else {
        uVar27 = (ulong)(uint)(*(int *)&pHVar11->colorvalue_stc_size * 3);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  (&local_420,uVar27);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  (&local_408,uVar27);
        if (local_480 != (IntBone_MDL7 **)0x0) {
          local_500.x = -NAN;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    (&local_3f0,uVar27,(value_type_conflict3 *)&local_500);
        }
        iVar5._0_2_ = pHVar11->bone_stc_size;
        iVar5._2_2_ = pHVar11->skin_stc_size;
        if (iVar5 != 0) {
          local_500.x = 0.0;
          local_500.y = 0.0;
          local_500.z = 0.0;
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                    (&local_3d8,uVar27,&local_500);
          if (0x19 < local_4e8->triangle_stc_size) {
            local_500.x = 0.0;
            local_500.y = 0.0;
            local_500.z = 0.0;
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                      (&local_3c0,uVar27,&local_500);
            local_3a8 = true;
          }
        }
        iVar6._0_2_ = pHVar11->colorvalue_stc_size;
        iVar6._2_2_ = pHVar11->material_stc_size;
        std::vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>::resize
                  ((vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_> *)
                   local_438,(long)iVar6);
        ReadFaces_3DGS_MDL7(this,(IntGroupInfo_MDL7 *)&local_460,(IntGroupData_MDL7 *)local_438);
        SortByMaterials_3DGS_MDL7
                  (this,(IntGroupInfo_MDL7 *)&local_460,(IntGroupData_MDL7 *)local_438,&local_4e0);
        pcHeader = local_4e8;
        if ((_Base_ptr)local_490._M_current != local_498) {
          uVar24 = 1;
          uVar27 = 0;
          do {
            if ((local_4e0.aiSplit[uVar27]->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start !=
                (local_4e0.aiSplit[uVar27]->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              *(_func_int **)(local_4c0._0_8_ + (ulong)(uVar24 - 1 >> 6) * 8) =
                   (_func_int *)
                   ((ulong)*(_func_int **)(local_4c0._0_8_ + (ulong)(uVar24 - 1 >> 6) * 8) |
                   1L << ((byte)uVar27 & 0x3f));
            }
            uVar27 = (ulong)uVar24;
            uVar24 = uVar24 + 1;
          } while (uVar27 < (ulong)((long)local_490._M_current - (long)local_498 >> 3));
        }
      }
      ProcessFrames_3DGS_MDL7
                (this,(IntGroupInfo_MDL7 *)&local_460,(IntGroupData_MDL7 *)local_438,
                 (IntSharedData_MDL7 *)local_4c0,(uchar *)local_510,(uchar **)&local_510);
      GenerateOutputMeshes_3DGS_MDL7(this,(IntGroupData_MDL7 *)local_438,&local_4e0);
      if (local_3c0.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3c0.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_3d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3d8.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_3f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((aiScene *)
          local_408.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (aiScene *)0x0) {
        operator_delete(local_408.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_420.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_420.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((void *)CONCAT44(local_438._4_4_,local_438._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_438._4_4_,local_438._0_4_));
      }
      MDL::IntSplitGroupData_MDL7::~IntSplitGroupData_MDL7(&local_4e0);
      uVar27 = local_508 + 1;
    } while (uVar27 < pcHeader->groups_num);
  }
  paVar16 = (aiNode *)operator_new(0x478);
  _Var29._M_p = local_470._M_p;
  aiNode::aiNode(paVar16);
  this->pScene->mRootNode = paVar16;
  if (pcHeader->groups_num != 0) {
    puVar17 = (ulong *)(_Var29._M_p + 0x10);
    uVar27 = 0;
    do {
      puVar20 = &this->pScene->mNumMeshes;
      *puVar20 = *puVar20 + (int)(*puVar17 - puVar17[-1] >> 3);
      uVar27 = uVar27 + 1;
      puVar17 = puVar17 + 3;
    } while (uVar27 < pcHeader->groups_num);
  }
  paVar7 = this->pScene;
  ppaVar18 = (aiMesh **)operator_new__((ulong)paVar7->mNumMeshes << 3);
  ppIVar31 = local_480;
  paVar7->mMeshes = ppaVar18;
  if (pcHeader->groups_num != 0) {
    uVar27 = 0;
    iVar22 = 0;
    do {
      ppaVar25 = local_4f0[uVar27].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (local_4f0[uVar27].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppaVar25) {
        uVar24 = 1;
        uVar28 = 0;
        do {
          this->pScene->mMeshes[(iVar22 + uVar24) - 1] = ppaVar25[uVar28];
          uVar28 = (ulong)uVar24;
          ppaVar25 = local_4f0[uVar27].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppaVar8 = local_4f0[uVar27].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar24 = uVar24 + 1;
        } while (uVar28 < (ulong)((long)ppaVar8 - (long)ppaVar25 >> 3));
        iVar22 = iVar22 + uVar24 + -1;
        if (ppaVar25 != ppaVar8) {
          puVar20 = &this->pScene->mRootNode->mNumChildren;
          *puVar20 = *puVar20 + 1;
        }
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 < pcHeader->groups_num);
  }
  if (local_480 != (IntBone_MDL7 **)0x0) {
    puVar20 = &this->pScene->mRootNode->mNumChildren;
    *puVar20 = *puVar20 + 1;
  }
  paVar7 = this->pScene;
  ppaVar19 = (aiNode **)operator_new__((ulong)paVar7->mRootNode->mNumChildren << 3);
  paVar7->mRootNode->mChildren = ppaVar19;
  uVar12 = pcHeader->groups_num;
  if (uVar12 != 0) {
    uVar28 = 0;
    local_508 = local_508 & 0xffffffff00000000;
    uVar27 = 0;
    pvVar23 = local_4f0;
    do {
      if (pvVar23[uVar28].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          pvVar23[uVar28].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        paVar16 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar16);
        pvVar23 = local_4f0 + uVar28;
        this->pScene->mRootNode->mChildren[uVar27] = paVar16;
        uVar26 = (long)(pvVar23->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pvVar23->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                       super__Vector_impl_data._M_start;
        uVar24 = (uint)(uVar26 >> 3);
        paVar16->mNumMeshes = uVar24;
        puVar20 = (uint *)operator_new__(uVar26 >> 1 & 0x3fffffffc);
        paVar16->mMeshes = puVar20;
        paVar16->mParent = this->pScene->mRootNode;
        if (uVar24 == 0) {
          iVar22 = 0;
        }
        else {
          uVar26 = 0;
          do {
            paVar16->mMeshes[uVar26] = (int)local_508 + (int)uVar26;
            uVar26 = uVar26 + 1;
          } while (uVar26 < paVar16->mNumMeshes);
          iVar22 = (int)((ulong)((long)(pvVar23->
                                       super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(pvVar23->
                                      super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                                      _M_impl.super__Vector_impl_data._M_start) >> 3);
        }
        uVar26 = (ulong)(uint)((int)uVar28 << 4);
        __s = (char *)((long)local_4c8 + uVar26);
        if (*(char *)((long)local_4c8 + uVar26) == '\0') {
          aVar13 = snprintf(__s,local_468 - uVar26,"Group_%u",uVar27);
        }
        else {
          sVar21 = strlen(__s);
          aVar13 = (ai_uint32)sVar21;
        }
        local_508 = CONCAT44(local_508._4_4_,(int)local_508 + iVar22);
        (paVar16->mName).length = aVar13;
        strncpy((paVar16->mName).data,__s,0x3ff);
        uVar27 = (ulong)((int)uVar27 + 1);
        uVar12 = local_4e8->groups_num;
        pvVar23 = local_4f0;
      }
      uVar28 = uVar28 + 1;
      _Var29._M_p = local_470._M_p;
      ppIVar31 = local_480;
    } while (uVar28 < uVar12);
  }
  paVar16 = this->pScene->mRootNode;
  if ((paVar16->mNumChildren == 1) && (ppIVar31 == (IntBone_MDL7 **)0x0)) {
    this->pScene->mRootNode = *paVar16->mChildren;
    *paVar16->mChildren = (aiNode *)0x0;
    aiNode::~aiNode(paVar16);
    operator_delete(paVar16);
    this->pScene->mRootNode->mParent = (aiNode *)0x0;
  }
  else {
    (paVar16->mName).length = 0xb;
    builtin_strncpy((paVar16->mName).data,"<mesh_root>",0xc);
  }
  if (*(ulong *)_Var29._M_p != 0) {
    lVar30 = *(ulong *)_Var29._M_p * 0x18;
    do {
      pvVar9 = *(void **)((long)_Var29._M_p + lVar30 + -0x10);
      if (pvVar9 != (void *)0x0) {
        operator_delete(pvVar9);
      }
      lVar30 = lVar30 + -0x18;
    } while (lVar30 != 0);
  }
  operator_delete__(_Var29._M_p);
  operator_delete__(local_4c8);
  CopyMaterials_3DGS_MDL7(this,(IntSharedData_MDL7 *)local_4c0);
  HandleMaterialReferences_3DGS_MDL7(this);
  if (local_480 != (IntBone_MDL7 **)0x0) {
    this_00 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_00);
    paVar16 = this->pScene->mRootNode;
    paVar16->mChildren[paVar16->mNumChildren - 1] = this_00;
    (this_00->mName).length = 0xf;
    builtin_strncpy((this_00->mName).data,"<skeleton_root>",0x10);
    AddBonesToNodeGraph_3DGS_MDL7(this,local_480,this_00,0xffff);
    BuildOutputAnims_3DGS_MDL7(this,local_480);
  }
  MDL::IntSharedData_MDL7::~IntSharedData_MDL7((IntSharedData_MDL7 *)local_4c0);
  return;
}

Assistant:

void MDLImporter::InternReadFile_3DGS_MDL7( )
{
    ai_assert(NULL != pScene);

    MDL::IntSharedData_MDL7 sharedData;

    // current cursor position in the file
    BE_NCONST MDL::Header_MDL7 *pcHeader = (BE_NCONST MDL::Header_MDL7*)this->mBuffer;
    const unsigned char* szCurrent = (const unsigned char*)(pcHeader+1);

    AI_SWAP4(pcHeader->version);
    AI_SWAP4(pcHeader->bones_num);
    AI_SWAP4(pcHeader->groups_num);
    AI_SWAP4(pcHeader->data_size);
    AI_SWAP4(pcHeader->entlump_size);
    AI_SWAP4(pcHeader->medlump_size);
    AI_SWAP2(pcHeader->bone_stc_size);
    AI_SWAP2(pcHeader->skin_stc_size);
    AI_SWAP2(pcHeader->colorvalue_stc_size);
    AI_SWAP2(pcHeader->material_stc_size);
    AI_SWAP2(pcHeader->skinpoint_stc_size);
    AI_SWAP2(pcHeader->triangle_stc_size);
    AI_SWAP2(pcHeader->mainvertex_stc_size);
    AI_SWAP2(pcHeader->framevertex_stc_size);
    AI_SWAP2(pcHeader->bonetrans_stc_size);
    AI_SWAP2(pcHeader->frame_stc_size);

    // validate the header of the file. There are some structure
    // sizes that are expected by the loader to be constant
    this->ValidateHeader_3DGS_MDL7(pcHeader);

    // load all bones (they are shared by all groups, so
    // we'll need to add them to all groups/meshes later)
    // apcBonesOut is a list of all bones or NULL if they could not been loaded
    szCurrent += pcHeader->bones_num * pcHeader->bone_stc_size;
    sharedData.apcOutBones = this->LoadBones_3DGS_MDL7();

    // vector to held all created meshes
    std::vector<aiMesh*>* avOutList;

    // 3 meshes per group - that should be OK for most models
    avOutList = new std::vector<aiMesh*>[pcHeader->groups_num];
    for (uint32_t i = 0; i < pcHeader->groups_num;++i)
        avOutList[i].reserve(3);

    // buffer to held the names of all groups in the file
	const size_t buffersize( AI_MDL7_MAX_GROUPNAMESIZE*pcHeader->groups_num );
	char* aszGroupNameBuffer = new char[ buffersize ];

    // read all groups
    for (unsigned int iGroup = 0; iGroup < (unsigned int)pcHeader->groups_num;++iGroup) {
        MDL::IntGroupInfo_MDL7 groupInfo((BE_NCONST MDL::Group_MDL7*)szCurrent,iGroup);
        szCurrent = (const unsigned char*)(groupInfo.pcGroup+1);

        VALIDATE_FILE_SIZE(szCurrent);

        AI_SWAP4(groupInfo.pcGroup->groupdata_size);
        AI_SWAP4(groupInfo.pcGroup->numskins);
        AI_SWAP4(groupInfo.pcGroup->num_stpts);
        AI_SWAP4(groupInfo.pcGroup->numtris);
        AI_SWAP4(groupInfo.pcGroup->numverts);
        AI_SWAP4(groupInfo.pcGroup->numframes);

        if (1 != groupInfo.pcGroup->typ)    {
            // Not a triangle-based mesh
            ASSIMP_LOG_WARN("[3DGS MDL7] Not a triangle mesh group. Continuing happily");
        }

        // store the name of the group
        const unsigned int ofs = iGroup*AI_MDL7_MAX_GROUPNAMESIZE;
        ::memcpy(&aszGroupNameBuffer[ofs],
            groupInfo.pcGroup->name,AI_MDL7_MAX_GROUPNAMESIZE);

        // make sure '\0' is at the end
        aszGroupNameBuffer[ofs+AI_MDL7_MAX_GROUPNAMESIZE-1] = '\0';

        // read all skins
        sharedData.pcMats.reserve(sharedData.pcMats.size() + groupInfo.pcGroup->numskins);
        sharedData.abNeedMaterials.resize(sharedData.abNeedMaterials.size() +
            groupInfo.pcGroup->numskins,false);

        for (unsigned int iSkin = 0; iSkin < (unsigned int)groupInfo.pcGroup->numskins;++iSkin) {
            ParseSkinLump_3DGS_MDL7(szCurrent,&szCurrent,sharedData.pcMats);
        }
        // if we have absolutely no skin loaded we need to generate a default material
        if (sharedData.pcMats.empty())  {
            const int iMode = (int)aiShadingMode_Gouraud;
            sharedData.pcMats.push_back(new aiMaterial());
            aiMaterial* pcHelper = (aiMaterial*)sharedData.pcMats[0];
            pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

            aiColor3D clr;
            clr.b = clr.g = clr.r = 0.6f;
            pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
            pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

            clr.b = clr.g = clr.r = 0.05f;
            pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

            aiString szName;
            szName.Set(AI_DEFAULT_MATERIAL_NAME);
            pcHelper->AddProperty(&szName,AI_MATKEY_NAME);

            sharedData.abNeedMaterials.resize(1,false);
        }

        // now get a pointer to all texture coords in the group
        groupInfo.pcGroupUVs = (BE_NCONST MDL::TexCoord_MDL7*)szCurrent;
        for(int i = 0; i < groupInfo.pcGroup->num_stpts; ++i){
            AI_SWAP4(groupInfo.pcGroupUVs[i].u);
            AI_SWAP4(groupInfo.pcGroupUVs[i].v);
        }
        szCurrent += pcHeader->skinpoint_stc_size * groupInfo.pcGroup->num_stpts;

        // now get a pointer to all triangle in the group
        groupInfo.pcGroupTris = (Triangle_MDL7*)szCurrent;
        szCurrent += pcHeader->triangle_stc_size * groupInfo.pcGroup->numtris;

        // now get a pointer to all vertices in the group
        groupInfo.pcGroupVerts = (BE_NCONST MDL::Vertex_MDL7*)szCurrent;
        for(int i = 0; i < groupInfo.pcGroup->numverts; ++i){
            AI_SWAP4(groupInfo.pcGroupVerts[i].x);
            AI_SWAP4(groupInfo.pcGroupVerts[i].y);
            AI_SWAP4(groupInfo.pcGroupVerts[i].z);

            AI_SWAP2(groupInfo.pcGroupVerts[i].vertindex);
            //We can not swap the normal information now as we don't know which of the two kinds it is
        }
        szCurrent += pcHeader->mainvertex_stc_size * groupInfo.pcGroup->numverts;
        VALIDATE_FILE_SIZE(szCurrent);

        MDL::IntSplitGroupData_MDL7 splitGroupData(sharedData,avOutList[iGroup]);
        MDL::IntGroupData_MDL7 groupData;
        if (groupInfo.pcGroup->numtris && groupInfo.pcGroup->numverts)
        {
            // build output vectors
            const unsigned int iNumVertices = groupInfo.pcGroup->numtris*3;
            groupData.vPositions.resize(iNumVertices);
            groupData.vNormals.resize(iNumVertices);

            if (sharedData.apcOutBones)groupData.aiBones.resize(iNumVertices,UINT_MAX);

            // it is also possible that there are 0 UV coordinate sets
            if (groupInfo.pcGroup->num_stpts){
                groupData.vTextureCoords1.resize(iNumVertices,aiVector3D());

                // check whether the triangle data structure is large enough
                // to contain a second UV coordinate set
                if (pcHeader->triangle_stc_size >= AI_MDL7_TRIANGLE_STD_SIZE_TWO_UV)    {
                    groupData.vTextureCoords2.resize(iNumVertices,aiVector3D());
                    groupData.bNeed2UV = true;
                }
            }
            groupData.pcFaces.resize(groupInfo.pcGroup->numtris);

            // read all faces into the preallocated arrays
            ReadFaces_3DGS_MDL7(groupInfo, groupData);

            // sort by materials
            SortByMaterials_3DGS_MDL7(groupInfo, groupData,
                splitGroupData);

            for (unsigned int qq = 0; qq < sharedData.pcMats.size();++qq)   {
                if (!splitGroupData.aiSplit[qq]->empty())
                    sharedData.abNeedMaterials[qq] = true;
            }
        }
        else ASSIMP_LOG_WARN("[3DGS MDL7] Mesh group consists of 0 "
            "vertices or faces. It will be skipped.");

        // process all frames and generate output meshes
        ProcessFrames_3DGS_MDL7(groupInfo,groupData, sharedData,szCurrent,&szCurrent);
        GenerateOutputMeshes_3DGS_MDL7(groupData,splitGroupData);
    }

    // generate a nodegraph and subnodes for each group
    pScene->mRootNode = new aiNode();

    // now we need to build a final mesh list
    for (uint32_t i = 0; i < pcHeader->groups_num;++i)
        pScene->mNumMeshes += (unsigned int)avOutList[i].size();

    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];  {
        unsigned int p = 0,q = 0;
        for (uint32_t i = 0; i < pcHeader->groups_num;++i)  {
            for (unsigned int a = 0; a < avOutList[i].size();++a)   {
                pScene->mMeshes[p++] = avOutList[i][a];
            }
            if (!avOutList[i].empty())++pScene->mRootNode->mNumChildren;
        }
        // we will later need an extra node to serve as parent for all bones
        if (sharedData.apcOutBones)++pScene->mRootNode->mNumChildren;
        this->pScene->mRootNode->mChildren = new aiNode*[pScene->mRootNode->mNumChildren];
        p = 0;
        for (uint32_t i = 0; i < pcHeader->groups_num;++i)  {
            if (avOutList[i].empty())continue;

            aiNode* const pcNode = pScene->mRootNode->mChildren[p] = new aiNode();
            pcNode->mNumMeshes = (unsigned int)avOutList[i].size();
            pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];
            pcNode->mParent = this->pScene->mRootNode;
            for (unsigned int a = 0; a < pcNode->mNumMeshes;++a)
                pcNode->mMeshes[a] = q + a;
            q += (unsigned int)avOutList[i].size();

            // setup the name of the node
            char* const szBuffer = &aszGroupNameBuffer[i*AI_MDL7_MAX_GROUPNAMESIZE];
			if ('\0' == *szBuffer) {
				const size_t maxSize(buffersize - (i*AI_MDL7_MAX_GROUPNAMESIZE));
				pcNode->mName.length = ai_snprintf(szBuffer, maxSize, "Group_%u", p);
			} else {
				pcNode->mName.length = ::strlen(szBuffer);
			}
            ::strncpy(pcNode->mName.data,szBuffer,MAXLEN-1);
            ++p;
        }
    }

    // if there is only one root node with a single child we can optimize it a bit ...
    if (1 == pScene->mRootNode->mNumChildren && !sharedData.apcOutBones)    {
        aiNode* pcOldRoot = this->pScene->mRootNode;
        pScene->mRootNode = pcOldRoot->mChildren[0];
        pcOldRoot->mChildren[0] = NULL;
        delete pcOldRoot;
        pScene->mRootNode->mParent = NULL;
    }
    else pScene->mRootNode->mName.Set("<mesh_root>");

    delete[] avOutList;
    delete[] aszGroupNameBuffer;
    AI_DEBUG_INVALIDATE_PTR(avOutList);
    AI_DEBUG_INVALIDATE_PTR(aszGroupNameBuffer);

    // build a final material list.
    CopyMaterials_3DGS_MDL7(sharedData);
    HandleMaterialReferences_3DGS_MDL7();

    // generate output bone animations and add all bones to the scenegraph
    if (sharedData.apcOutBones) {
        // this step adds empty dummy bones to the nodegraph
        // insert another dummy node to avoid name conflicts
        aiNode* const pc = pScene->mRootNode->mChildren[pScene->mRootNode->mNumChildren-1] = new aiNode();

        pc->mName.Set("<skeleton_root>");

        // add bones to the nodegraph
        AddBonesToNodeGraph_3DGS_MDL7((const Assimp::MDL::IntBone_MDL7 **)
            sharedData.apcOutBones,pc,0xffff);

        // this steps build a valid output animation
        BuildOutputAnims_3DGS_MDL7((const Assimp::MDL::IntBone_MDL7 **)
            sharedData.apcOutBones);
    }
}